

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

int __thiscall CVmObjStringBuffer::equals_str(CVmObjStringBuffer *this,char *str)

{
  int iVar1;
  wchar_t wVar2;
  vm_strbuf_ext *pvVar3;
  size_t sVar4;
  CVmObjStringBuffer *in_RDI;
  int32_t i;
  int32_t len2;
  int32_t len1;
  utf8_ptr p2;
  wchar_t *p1;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  wchar_t wVar5;
  int local_34;
  wchar_t *local_20;
  int local_4;
  
  pvVar3 = get_ext(in_RDI);
  local_20 = pvVar3->buf;
  utf8_ptr::utf8_ptr((utf8_ptr *)in_RDI,
                     (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  pvVar3 = get_ext(in_RDI);
  iVar1 = pvVar3->len;
  vmb_get_len((char *)0x38b313);
  sVar4 = utf8_ptr::len((utf8_ptr *)in_RDI,
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (iVar1 == (int)sVar4) {
    local_34 = 0;
    while (local_34 < iVar1) {
      wVar5 = *local_20;
      wVar2 = utf8_ptr::getch((utf8_ptr *)0x38b35f);
      if (wVar5 != wVar2) {
        return 0;
      }
      local_34 = local_34 + 1;
      local_20 = local_20 + 1;
      utf8_ptr::inc((utf8_ptr *)in_RDI);
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVmObjStringBuffer::equals_str(const char *str) const
{
    /* get the buffer pointers and character lengths */
    const wchar_t *p1 = get_ext()->buf;
    utf8_ptr p2((char *)str + VMB_LEN);
    int32_t len1 = get_ext()->len, len2 = p2.len(vmb_get_len(str));

    /* if the lengths don't match, we can't be equal */
    if (len1 != len2)
        return FALSE;

    /* compare character by character */
    for (int32_t i = 0 ; i < len1 ; ++i, ++p1, p2.inc())
    {
        if (*p1 != p2.getch())
            return FALSE;
    }

    /* the characters match */
    return TRUE;
}